

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O1

int __thiscall MemFile::open(MemFile *this,char *__file,int __oflag,...)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  FILE *pFVar7;
  size_t sVar8;
  unzFile file;
  long lVar9;
  uint8_t *puVar10;
  undefined1 *extraout_RAX;
  undefined1 *puVar11;
  exception *peVar12;
  posix_error *ppVar13;
  byte bVar14;
  uLong __n;
  ulong uVar15;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zbuf;
  int nRet;
  gz_header header;
  unz_file_info sInfo;
  char szFile [512];
  undefined1 *local_538;
  char *local_530;
  undefined1 local_528;
  undefined7 uStack_527;
  void *local_518;
  int local_510;
  long local_508;
  int *local_500;
  void *local_4f8;
  ulong uStack_4f0;
  undefined8 local_4e8;
  void *pvStack_4e0;
  undefined8 local_4d8;
  int **ppiStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  int local_488 [10];
  unz_file_info *puStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  unz_file_info local_438 [3];
  int *local_238;
  undefined8 local_230;
  uint8_t *local_220;
  long local_218;
  undefined8 auStack_150 [36];
  
  local_538 = &local_528;
  local_530 = (char *)0x0;
  local_528 = 0;
  piVar5 = (int *)AllocMem(0x10000001);
  pcVar6 = (char *)zlibVersion();
  cVar1 = *pcVar6;
  bVar14 = (byte)__oflag;
  if ((cVar1 == '1' & bVar14) == 1) {
    pFVar7 = fopen64(*(char **)__file,"rb");
    if (pFVar7 == (FILE *)0x0) {
      ppVar13 = (posix_error *)__cxa_allocate_exception(0x20);
      piVar5 = __errno_location();
      posix_error::posix_error(ppVar13,*piVar5,*(char **)__file);
      __cxa_throw(ppVar13,&posix_error::typeinfo,std::system_error::~system_error);
    }
    sVar8 = fread(piVar5,1,2,pFVar7);
    if (sVar8 == 0) {
      *(undefined2 *)piVar5 = 0;
    }
    fclose(pFVar7);
    if ((char)*piVar5 == '\x1f') {
      if (*(char *)((long)piVar5 + 1) != -0x75) goto LAB_001642dd;
      lVar9 = gzopen64(*(undefined8 *)__file,"rb");
      if (lVar9 == 0) {
        ppVar13 = (posix_error *)__cxa_allocate_exception(0x20);
        piVar5 = __errno_location();
        posix_error::posix_error(ppVar13,*piVar5,*(char **)__file);
        __cxa_throw(ppVar13,&posix_error::typeinfo,std::system_error::~system_error);
      }
      iVar3 = gzread(lVar9,piVar5,0x10000001);
      iVar4 = gzdirect(lVar9);
      this->m_compress = (uint)(iVar4 == 0) * 2;
      gzclose(lVar9);
      __n = (uLong)iVar3;
      if (this->m_compress == Gzip) {
        std::ifstream::ifstream(&local_238,*(char **)__file,_S_bin);
        __first._8_8_ = 0xffffffff;
        __first._M_sbuf = *(streambuf_type **)((long)auStack_150 + *(long *)(local_238 + -6));
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_518,__first,
                   (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40)
                   ,(allocator_type *)local_438);
        local_4e8 = 0;
        ppiStack_4d0 = (int **)0x0;
        local_498 = 0;
        uStack_490 = 0;
        local_4a8 = 0;
        uStack_4a0 = 0;
        local_4b8 = 0;
        uStack_4b0 = 0;
        local_4c8 = 0;
        uStack_4c0 = 0;
        local_4f8 = local_518;
        uStack_4f0 = (ulong)(uint)(local_510 - (int)local_518);
        pvStack_4e0 = local_518;
        local_4d8 = 0;
        iVar3 = inflateInit2_(&local_4f8,0x1f,"1.2.11",0x70);
        if (iVar3 == 0) {
          memset(local_438,0,0x200);
          local_488[8] = 0;
          local_488[9] = 0;
          uStack_450 = 0;
          local_448 = 0;
          uStack_440 = 0;
          local_488[4] = 0;
          local_488[5] = 0;
          local_488[6] = 0;
          local_488[7] = 0;
          local_488[0] = 0;
          local_488[1] = 0;
          local_488[2] = 0;
          local_488[3] = 0;
          local_458 = 0x200;
          puStack_460 = local_438;
          inflateGetHeader(&local_4f8);
          iVar3 = inflate(&local_4f8);
          if ((iVar3 == 0) && ((char)local_438[0].version != '\0')) {
            std::__cxx11::string::operator=((string *)&local_538,(char *)local_438);
          }
          inflateEnd(&local_4f8);
        }
        if (local_518 != (void *)0x0) {
          operator_delete(local_518,local_508 - (long)local_518);
        }
        std::ifstream::~ifstream(&local_238);
      }
    }
    else {
      if (((char)*piVar5 != 'P') || (*(char *)((long)piVar5 + 1) != 'K')) goto LAB_001642dd;
      file = unzOpen(*(char **)__file);
      if (file == (unzFile)0x0) {
        peVar12 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[13]>(peVar12,(char (*) [13])"bad zip file");
        __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = unzGoToFirstFile(file);
      uVar15 = 0;
      local_500 = piVar5;
      while( true ) {
        local_4f8 = (void *)CONCAT44(local_4f8._4_4_,iVar3);
        if (iVar3 != 0) break;
        unzGetCurrentFileInfo(file,local_438,(char *)&local_238,0x200,(void *)0x0,0,(char *)0x0,0);
        if (local_438[0].uncompressed_size == 0) {
LAB_001640b1:
          bVar2 = false;
        }
        else {
          iVar3 = GetFileType((char *)&local_238);
          if ((iVar3 == 0) || (iVar3 = unzOpenCurrentFile(file), iVar3 != 0)) {
            if (uVar15 < local_438[0].uncompressed_size) {
              uVar15 = local_438[0].uncompressed_size;
            }
            goto LAB_001640b1;
          }
          iVar3 = unzReadCurrentFile(file,piVar5,0x10000001);
          local_4f8 = (void *)CONCAT44(local_4f8._4_4_,iVar3);
          unzCloseCurrentFile(file);
          pcVar6 = local_530;
          strlen((char *)&local_238);
          piVar5 = local_500;
          bVar2 = true;
          std::__cxx11::string::_M_replace((ulong)&local_538,0,pcVar6,(ulong)&local_238);
        }
        if (bVar2) break;
        iVar3 = unzGoToNextFile(file);
      }
      if ((int)local_4f8 == -100) {
        iVar3 = unzGoToFirstFile(file);
        while( true ) {
          local_4f8 = (void *)CONCAT44(local_4f8._4_4_,iVar3);
          if (iVar3 != 0) break;
          unzGetCurrentFileInfo(file,local_438,(char *)0x0,0,(void *)0x0,0,(char *)0x0,0);
          if ((local_438[0].uncompressed_size == uVar15) &&
             (iVar3 = unzOpenCurrentFile(file), iVar3 == 0)) {
            iVar3 = unzReadCurrentFile(file,piVar5,0x10000001);
            local_4f8 = (void *)CONCAT44(local_4f8._4_4_,iVar3);
            unzCloseCurrentFile(file);
            break;
          }
          iVar3 = unzGoToNextFile(file);
        }
      }
      unzClose(file);
      __n = (uLong)(int)local_4f8;
      if ((long)__n < 0) {
        peVar12 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[24],int&,char_const(&)[2]>
                  (peVar12,(char (*) [24])"zip extraction failed (",(int *)&local_4f8,
                   (char (*) [2])0x1aefa0);
        __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      this->m_compress = Zip;
    }
  }
  else {
LAB_001642dd:
    __n = 0;
  }
  if (__n == 0) {
    pFVar7 = fopen64(*(char **)__file,"rb");
    if (pFVar7 == (FILE *)0x0) {
      ppVar13 = (posix_error *)__cxa_allocate_exception(0x20);
      piVar5 = __errno_location();
      posix_error::posix_error(ppVar13,*piVar5,*(char **)__file);
      __cxa_throw(ppVar13,&posix_error::typeinfo,std::system_error::~system_error);
    }
    __n = fread(piVar5,1,0x10000001,pFVar7);
    fclose(pFVar7);
    this->m_compress = None;
  }
  if (bVar14 != 0) {
    if (((char)*piVar5 == 'P') && (*(char *)((long)piVar5 + 1) == 'K')) {
      peVar12 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[47]>
                (peVar12,(char (*) [47])"zlib support is not available for zipped files");
      goto LAB_001647c2;
    }
    if ((bVar14 == 1 && (char)*piVar5 == '\x1f') && (*(char *)((long)piVar5 + 1) == -0x75)) {
      if (cVar1 != '1') {
        peVar12 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[48]>
                  (peVar12,(char (*) [48])"zlib support is not available for gzipped files");
        goto LAB_001647c2;
      }
      puVar10 = AllocMem(0x10000001);
      local_438[0].flag = 0;
      local_438[0].crc = 0;
      local_438[0].internal_fa = 0;
      local_438[0].external_fa = 0;
      local_438[0].size_file_comment = 0;
      local_438[0].disk_num_start = 0;
      local_438[0].size_filename = 0;
      local_438[0].size_file_extra = 0;
      local_438[0].compressed_size = 0;
      local_438[0].uncompressed_size = 0;
      local_438[0].version_needed = __n & 0xffffffff;
      local_438[0].dosDate = 0x10000001;
      local_438[0].version = (uLong)piVar5;
      local_438[0].compression_method = (uLong)puVar10;
      iVar3 = inflateInit2_(local_438,0x1f,"1.2.11",0x70);
      local_488[0] = iVar3;
      if (iVar3 == 0) {
        memset(&local_238,0,0x200);
        local_4d8 = 0;
        uStack_4c0 = 0;
        local_4b8 = 0;
        uStack_4b0 = 0;
        local_4e8 = 0;
        pvStack_4e0 = (void *)0x0;
        local_4f8 = (void *)0x0;
        uStack_4f0 = 0;
        local_4c8 = 0x200;
        ppiStack_4d0 = &local_238;
        iVar3 = inflateGetHeader(local_438);
        local_488[0] = iVar3;
        local_488[0] = inflate(local_438,4);
        if ((local_488[0] == 1) && ((char)local_238 != '\0')) {
          std::__cxx11::string::operator=((string *)&local_538,(char *)&local_238);
        }
        inflateEnd(local_438);
      }
      __n = local_438[0].crc;
      if (local_488[0] != 1) {
        peVar12 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[28],int&,char_const(&)[2]>
                  (peVar12,(char (*) [28])"gzip decompression failed (",local_488,
                   (char (*) [2])0x1aefa0);
        __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      memcpy(piVar5,puVar10,local_438[0].crc);
      this->m_compress = Zip;
      FreeMem(puVar10);
    }
  }
  if (bVar14 != 0) {
    if (((char)*piVar5 == 'B') && (*(char *)((long)piVar5 + 1) == 'Z')) {
      peVar12 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[31]>
                (peVar12,(char (*) [31])"bzip2 support is not available");
      goto LAB_001647c2;
    }
    if ((bVar14 != 0) && ((short)piVar5[1] == 0x5a && *piVar5 == 0x587a37fd)) {
      puVar10 = AllocMem(0x10000001);
      memset(&local_238,0,0x88);
      iVar3 = lzma_stream_decoder(&local_238,0xffffffffffffffff,2);
      local_438[0].version = CONCAT44(local_438[0].version._4_4_,iVar3);
      if (iVar3 == 0) {
        local_230 = 0x10000001;
        local_218 = 0x10000001;
        local_238 = piVar5;
        local_220 = puVar10;
        iVar3 = lzma_code(&local_238,3);
        local_438[0].version = CONCAT44(local_438[0].version._4_4_,iVar3);
        if (iVar3 == 1) {
          __n = 0x10000001 - local_218;
          memcpy(piVar5,puVar10,__n);
          this->m_compress = Xz;
          local_438[0].version = local_438[0].version & 0xffffffff00000000;
        }
      }
      if ((int)local_438[0].version != 0) {
        peVar12 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[26],lzma_ret&,char_const(&)[2]>
                  (peVar12,(char (*) [26])"xz decompression failed (",(lzma_ret *)local_438,
                   (char (*) [2])0x1aefa0);
        __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      FreeMem(puVar10);
    }
  }
  if (__n < 0x10000001) {
    open(this,(char *)piVar5,(int)__n,__file,&local_538);
    FreeMem(piVar5);
    puVar11 = &local_528;
    if (local_538 != puVar11) {
      operator_delete(local_538,CONCAT71(uStack_527,local_528) + 1);
      puVar11 = extraout_RAX;
    }
    return (int)CONCAT71((int7)((ulong)puVar11 >> 8),1);
  }
  peVar12 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[18]>(peVar12,(char (*) [18])"file size too big");
LAB_001647c2:
  __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool MemFile::open(const std::string& path_, bool uncompress)
{
    std::string filename;
    MEMORY mem(MAX_IMAGE_SIZE + 1);
    size_t uRead = 0;

    // Check if zlib is available
#ifndef HAVE_ZLIB
    bool have_zlib = false;
#else
    bool have_zlib = zlibVersion()[0] == ZLIB_VERSION[0];

    // Read start of file to check for compression signatures.
    if (uncompress && have_zlib)
    {
        FILE* f = fopen(path_.c_str(), "rb");
        if (!f)
            throw posix_error(errno, path_.c_str());

        if (!fread(mem, 1, 2, f))
            mem[0] = mem[1] = '\0';

        fclose(f);
    }

    if (uncompress && have_zlib)
    {
        // Require zip file header magic.
        if (mem[0U] == 'P' && mem[1U] == 'K')
        {
            unzFile hfZip = unzOpen(path_.c_str());
            if (!hfZip)
                throw util::exception("bad zip file");

            int nRet;
            unz_file_info sInfo;
            uLong ulMaxSize = 0;

            // Iterate through the contents of the zip looking for a file with a suitable size
            for (nRet = unzGoToFirstFile(hfZip); nRet == UNZ_OK; nRet = unzGoToNextFile(hfZip))
            {
                char szFile[MAX_PATH];

                // Get details of the current file
                unzGetCurrentFileInfo(hfZip, &sInfo, szFile, MAX_PATH, nullptr, 0, nullptr, 0);

                // Ignore directories and empty files
                if (!sInfo.uncompressed_size)
                    continue;

                // If the file extension is recognised, read the file contents
                // ToDo: GetFileType doesn't really belong here?
                if (GetFileType(szFile) != ftUnknown && unzOpenCurrentFile(hfZip) == UNZ_OK)
                {
                    nRet = unzReadCurrentFile(hfZip, mem, static_cast<unsigned int>(mem.size));
                    unzCloseCurrentFile(hfZip);
                    filename = szFile;
                    break;
                }

                // Rememeber the largest uncompressed file size
                if (sInfo.uncompressed_size > ulMaxSize)
                    ulMaxSize = sInfo.uncompressed_size;
            }

            // Did we fail to find a matching extension?
            if (nRet == UNZ_END_OF_LIST_OF_FILE)
            {
                // Loop back over the archive
                for (nRet = unzGoToFirstFile(hfZip); nRet == UNZ_OK; nRet = unzGoToNextFile(hfZip))
                {
                    // Get details of the current file
                    unzGetCurrentFileInfo(hfZip, &sInfo, nullptr, 0, nullptr, 0, nullptr, 0);

                    // Open the largest file found about
                    if (sInfo.uncompressed_size == ulMaxSize && unzOpenCurrentFile(hfZip) == UNZ_OK)
                    {
                        nRet = unzReadCurrentFile(hfZip, mem, static_cast<unsigned int>(mem.size));
                        unzCloseCurrentFile(hfZip);
                        break;
                    }
                }
            }

            // Close the zip archive
            unzClose(hfZip);

            if (nRet < 0)
                throw util::exception("zip extraction failed (", nRet, ")");

            uRead = nRet;
            m_compress = Compress::Zip;
        }
        // Require gzip file header magic.
        else if (mem[0U] == 0x1f && mem[1U] == 0x8b)
        {
            // Open as gzipped or uncompressed
            gzFile gf = gzopen(path_.c_str(), "rb");
            if (gf == Z_NULL)
                throw posix_error(errno, path_.c_str());

            uRead = gzread(gf, mem, static_cast<unsigned>(mem.size));
            m_compress = gzdirect(gf) ? Compress::None : Compress::Gzip;
            gzclose(gf);

            // If gzipped, attempt to extract the original filename
            if (m_compress == Compress::Gzip)
            {
                std::ifstream zs(path_.c_str(), std::ios_base::binary);
                std::vector<uint8_t> zbuf((std::istreambuf_iterator<char>(zs)),
                    std::istreambuf_iterator<char>());

                z_stream stream{};
                stream.next_in = zbuf.data();
                stream.avail_in = static_cast<uInt>(zbuf.size());
                stream.next_out = zbuf.data();  // same as next_in!
                stream.avail_out = 0;           // we don't want data

                auto zerr = inflateInit2(&stream, 16 + MAX_WBITS); // 16=gzip
                if (zerr == Z_OK)
                {
                    Bytef name[MAX_PATH]{};
                    gz_header header{};
                    header.name = name;
                    header.name_max = MAX_PATH;

                    zerr = inflateGetHeader(&stream, &header);
                    zerr = inflate(&stream, 0);
                    if (zerr == Z_OK && name[0])
                        filename = reinterpret_cast<const char*>(name);
                    inflateEnd(&stream);
                }
            }
        }
    }
#endif // HAVE_ZLIB

    // If didn't read as a compressed file, open as normal file.
    if (!uRead)
    {
        FILE* f = fopen(path_.c_str(), "rb");
        if (!f)
            throw posix_error(errno, path_.c_str());

        uRead = fread(mem, 1, mem.size, f);
        fclose(f);
        m_compress = Compress::None;
    }

    // zip compressed? (and not handled above)
    if (uncompress && mem[0U] == 'P' && mem[1U] == 'K')
        throw util::exception("zlib support is not available for zipped files");
    // gzip compressed?
    if (uncompress && mem[0U] == 0x1f && mem[1U] == 0x8b)
    {
        if (!have_zlib)
            throw util::exception("zlib support is not available for gzipped files");

        // Unknowingly gzipped image files may be zipped, so we need to handle
        // a second level of decompression here.
#ifdef HAVE_ZLIB
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        z_stream stream{};
        stream.next_in = mem.pb;
        stream.avail_in = static_cast<uInt>(uRead);
        stream.next_out = mem2.pb;
        stream.avail_out = static_cast<uInt>(mem2.size);

        auto zerr = inflateInit2(&stream, 16 + MAX_WBITS);
        if (zerr == Z_OK)
        {
            Bytef name[MAX_PATH]{};
            gz_header header{};
            header.name = name;
            header.name_max = MAX_PATH;

            zerr = inflateGetHeader(&stream, &header);
            zerr = inflate(&stream, Z_FINISH);
            if (zerr == Z_STREAM_END && name[0])
                filename = reinterpret_cast<const char*>(name);
            inflateEnd(&stream);
        }

        if (zerr != Z_STREAM_END)
            throw util::exception("gzip decompression failed (", zerr, ")");

        memcpy(mem.pb, mem2.pb, uRead = stream.total_out);
        m_compress = Compress::Zip;
#endif
    }

    // bzip2 compressed?
    if (uncompress && mem[0U] == 'B' && mem[1U] == 'Z')
    {
#ifndef HAVE_BZIP2
        throw util::exception("bzip2 support is not available");
#else
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        auto uBzRead = static_cast<unsigned>(mem2.size);
        auto bzerr = BZ2_bzBuffToBuffDecompress(
            reinterpret_cast<char*>(mem2.pb), &uBzRead,
            reinterpret_cast<char*>(mem.pb), static_cast<int>(uRead), 0, 0);
        if (bzerr != BZ_OK)
            throw util::exception("bzip2 decompression failed (", bzerr, ")");

        memcpy(mem.pb, mem2.pb, uRead = uBzRead);
        m_compress = Compress::Bzip2;
#endif // HAVE_BZIP2
    }

    if (uncompress && mem.size > 6 && !memcmp(mem.pb, "\xfd\x37\x7a\x58\x5a\x00", 6))
    {
#ifndef HAVE_LZMA
        throw util::exception("lzma support is not available");
#else
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        lzma_stream strm{};
        const uint32_t flags = LZMA_TELL_UNSUPPORTED_CHECK;
        auto ret = lzma_stream_decoder(&strm, UINT64_MAX, flags);
        if (ret == LZMA_OK)
        {
            strm.next_in = mem.pb;
            strm.avail_in = mem.size;
            strm.next_out = mem2.pb;
            strm.avail_out = mem2.size;

            ret = lzma_code(&strm, LZMA_FINISH);
            if (ret == LZMA_STREAM_END)
            {
                uRead = mem2.size - strm.avail_out;
                memcpy(mem.pb, mem2.pb, uRead);
                m_compress = Compress::Xz;
                ret = LZMA_OK;
            }
        }

        if (ret != LZMA_OK)
            throw util::exception("xz decompression failed (", ret, ")");
#endif
    }

    if (uRead <= MAX_IMAGE_SIZE)
        return open(mem.pb, static_cast<int>(uRead), path_, filename);

    throw util::exception("file size too big");
}